

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O2

ACES * __thiscall
AS_02::ACES::ACES_PDesc_to_MD
          (ACES *this,PictureDescriptor *PDesc,Dictionary *dict,
          RGBAEssenceDescriptor *EssenceDescriptor)

{
  chlist *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  Rational RVar9;
  undefined8 *puVar10;
  const_reference pvVar11;
  int iVar12;
  undefined1 *puVar13;
  MDD_t MVar14;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  *(ulong *)(EssenceDescriptor + 0xf8) = (ulong)PDesc->ContainerDuration;
  EssenceDescriptor[0x100] = (RGBAEssenceDescriptor)0x1;
  *(Rational *)(EssenceDescriptor + 0xf0) = PDesc->EditRate;
  EssenceDescriptor[0x152] = (RGBAEssenceDescriptor)0x0;
  uVar1 = (PDesc->DataWindow).xMax;
  uVar2 = (PDesc->DataWindow).yMax;
  uVar5 = (PDesc->DataWindow).xMin;
  uVar6 = (PDesc->DataWindow).yMin;
  *(ulong *)(EssenceDescriptor + 0x154) = CONCAT44((uVar2 - uVar6) + 1,(uVar1 - uVar5) + 1);
  iVar3 = (PDesc->DisplayWindow).xMin;
  iVar8 = ((PDesc->DisplayWindow).xMax - iVar3) + 1;
  *(int *)(EssenceDescriptor + 0x18c) = iVar8;
  EssenceDescriptor[400] = (RGBAEssenceDescriptor)0x1;
  iVar4 = (PDesc->DisplayWindow).yMin;
  iVar12 = ((PDesc->DisplayWindow).yMax - iVar4) + 1;
  *(int *)(EssenceDescriptor + 0x184) = iVar12;
  EssenceDescriptor[0x188] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x194) = iVar3 - uVar5;
  EssenceDescriptor[0x198] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x19c) = iVar4 - uVar6;
  EssenceDescriptor[0x1a0] = (RGBAEssenceDescriptor)0x1;
  if (iVar12 != 0) {
    RVar9 = ConvertToRational((double)iVar8 / (double)iVar12);
    *(Rational *)(EssenceDescriptor + 0x1b8) = RVar9;
  }
  *(undefined2 *)(EssenceDescriptor + 0x1c2) = 0x100;
  MVar14 = (MDD_t)dict;
  puVar10 = (undefined8 *)ASDCP::Dictionary::Type(MVar14);
  local_48 = *puVar10;
  uStack_40 = puVar10[1];
  EssenceDescriptor[0x260] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x261) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x269) = uStack_40;
  EssenceDescriptor[0x278] = (RGBAEssenceDescriptor)0x1;
  puVar10 = (undefined8 *)ASDCP::Dictionary::Type(MVar14);
  local_48 = *puVar10;
  uStack_40 = puVar10[1];
  EssenceDescriptor[0x1d0] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x1d1) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x1d9) = uStack_40;
  EssenceDescriptor[0x1e8] = (RGBAEssenceDescriptor)0x1;
  this_00 = &PDesc->Channels;
  if ((long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_start == 0x90) {
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,0);
    bVar7 = std::operator==(&pvVar11->name,"B");
    if (!bVar7) goto LAB_0014ac3c;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,1);
    bVar7 = std::operator==(&pvVar11->name,"G");
    if (!bVar7) goto LAB_0014ac3c;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,2);
    bVar7 = std::operator==(&pvVar11->name,"R");
    if (!bVar7) goto LAB_0014ac3c;
    puVar10 = (undefined8 *)ASDCP::Dictionary::Type(MVar14);
    local_48 = *puVar10;
    uStack_40 = puVar10[1];
    EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
    *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
    *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
    puVar13 = ACESPixelLayoutMonoscopicWOAlpha;
LAB_0014ad03:
    ASDCP::MXF::RGBALayout::RGBALayout((RGBALayout *)&local_48,puVar13);
    *(undefined8 *)(EssenceDescriptor + 0x398) = uStack_40;
    *(undefined8 *)(EssenceDescriptor + 0x3a0) = uStack_38;
    ASDCP::MXF::RGBALayout::~RGBALayout((RGBALayout *)&local_48);
    puVar13 = Kumu::RESULT_OK;
    goto LAB_0014af10;
  }
LAB_0014ac3c:
  if ((long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_start == 0xc0) {
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,0);
    bVar7 = std::operator==(&pvVar11->name,"A");
    if (bVar7) {
      pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                          (this_00,1);
      bVar7 = std::operator==(&pvVar11->name,"B");
      if (bVar7) {
        pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                            (this_00,2);
        bVar7 = std::operator==(&pvVar11->name,"G");
        if (bVar7) {
          pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                              (this_00,3);
          bVar7 = std::operator==(&pvVar11->name,"R");
          if (bVar7) {
            puVar10 = (undefined8 *)ASDCP::Dictionary::Type(MVar14);
            local_48 = *puVar10;
            uStack_40 = puVar10[1];
            EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
            *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
            *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
            puVar13 = ACESPixelLayoutMonoscopicWAlpha;
            goto LAB_0014ad03;
          }
        }
      }
    }
  }
  if ((long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_start == 0x120) {
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,0);
    bVar7 = std::operator==(&pvVar11->name,"B");
    if (!bVar7) goto LAB_0014adfc;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,1);
    bVar7 = std::operator==(&pvVar11->name,"G");
    if (!bVar7) goto LAB_0014adfc;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,2);
    bVar7 = std::operator==(&pvVar11->name,"R");
    if (!bVar7) goto LAB_0014adfc;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,3);
    bVar7 = std::operator==(&pvVar11->name,"left.B");
    if (!bVar7) goto LAB_0014adfc;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,4);
    bVar7 = std::operator==(&pvVar11->name,"left.G");
    if (!bVar7) goto LAB_0014adfc;
    pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                        (this_00,5);
    bVar7 = std::operator==(&pvVar11->name,"left.R");
    if (!bVar7) goto LAB_0014adfc;
  }
  else {
LAB_0014adfc:
    if ((long)(PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x180) {
      pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                          (this_00,0);
      bVar7 = std::operator==(&pvVar11->name,"A");
      if (bVar7) {
        pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                            (this_00,1);
        bVar7 = std::operator==(&pvVar11->name,"B");
        if (bVar7) {
          pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                              (this_00,2);
          bVar7 = std::operator==(&pvVar11->name,"G");
          if (bVar7) {
            pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                                (this_00,3);
            bVar7 = std::operator==(&pvVar11->name,"R");
            if (bVar7) {
              pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                                  (this_00,4);
              bVar7 = std::operator==(&pvVar11->name,"left.A");
              if (bVar7) {
                pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::
                          at(this_00,5);
                bVar7 = std::operator==(&pvVar11->name,"left.B");
                if (bVar7) {
                  pvVar11 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                            ::at(this_00,6);
                  bVar7 = std::operator==(&pvVar11->name,"left.G");
                  if (bVar7) {
                    pvVar11 = std::
                              vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::
                              at(this_00,7);
                    std::operator==(&pvVar11->name,"left.R");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar13 = Kumu::RESULT_NOTIMPL;
LAB_0014af10:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar13);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::ACES_PDesc_to_MD(const PictureDescriptor &PDesc, const ASDCP::Dictionary &dict, ASDCP::MXF::RGBAEssenceDescriptor &EssenceDescriptor)
{

  EssenceDescriptor.ContainerDuration = PDesc.ContainerDuration;
  EssenceDescriptor.SampleRate = PDesc.EditRate;
  EssenceDescriptor.FrameLayout = 0x00;
  EssenceDescriptor.StoredWidth = PDesc.DataWindow.xMax - PDesc.DataWindow.xMin + 1;
  EssenceDescriptor.StoredHeight = PDesc.DataWindow.yMax - PDesc.DataWindow.yMin + 1;
  EssenceDescriptor.DisplayWidth = PDesc.DisplayWindow.xMax - PDesc.DisplayWindow.xMin + 1;
  EssenceDescriptor.DisplayHeight = PDesc.DisplayWindow.yMax - PDesc.DisplayWindow.yMin + 1;
  EssenceDescriptor.DisplayXOffset = PDesc.DisplayWindow.xMin - PDesc.DataWindow.xMin;
  EssenceDescriptor.DisplayYOffset = PDesc.DisplayWindow.yMin - PDesc.DataWindow.yMin;
  ASDCP::Rational aspect_ratio(EssenceDescriptor.DisplayWidth, EssenceDescriptor.DisplayHeight);
  if(aspect_ratio.Denominator != 0)  EssenceDescriptor.AspectRatio = AS_02::ConvertToRational(aspect_ratio.Quotient());
  EssenceDescriptor.AlphaTransparency = 0x00;
  EssenceDescriptor.ColorPrimaries = dict.ul(MDD_ColorPrimaries_ACES);
  EssenceDescriptor.TransferCharacteristic = dict.ul(MDD_TransferCharacteristic_linear);
  if(PDesc.Channels.size() == 3 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithoutAlpha); //Picture Essence Coding Label per 2065-5 section 8.2
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWOAlpha);
  }
  else if(PDesc.Channels.size() == 4 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithAlpha); //Picture Essence Coding Label per 2065-5
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWAlpha);
  }
  else if(PDesc.Channels.size() == 6 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R" &&
                            PDesc.Channels.at(3).name == "left.B" && PDesc.Channels.at(4).name == "left.G" && PDesc.Channels.at(5).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else if(PDesc.Channels.size() == 8 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R" &&
                            PDesc.Channels.at(4).name == "left.A" && PDesc.Channels.at(5).name == "left.B" && PDesc.Channels.at(6).name == "left.G" && PDesc.Channels.at(7).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else
  {
    return RESULT_NOTIMPL;
  }
  return RESULT_OK;
}